

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModelPrivate::updateChildrenMapping
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,Mapping *parent_mapping,
          Direction direction,int start,int end,int delta_item_count,bool remove)

{
  QAbstractItemModel *pQVar1;
  Mapping *pMVar2;
  quintptr qVar3;
  const_iterator pos_00;
  int iVar4;
  bool bVar5;
  uint uVar6;
  iterator o;
  QModelIndex *pQVar7;
  arrow_operator_result ppQVar8;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *i;
  int in_ECX;
  undefined8 in_RSI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  byte in_stack_00000010;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *pair;
  add_const_t<QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>_> *__range1;
  int newpos;
  int pos;
  const_iterator __end1;
  const_iterator __begin1;
  Mapping *cm;
  QModelIndex new_index;
  QModelIndex source_child_index;
  iterator it2;
  QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
  moved_source_index_mappings;
  QModelIndex *in_stack_fffffffffffffdd8;
  QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *in_stack_fffffffffffffde0
  ;
  QList<QModelIndex> *in_stack_fffffffffffffdf0;
  QModelIndex *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  uint local_1ac;
  int local_194;
  QModelIndexWrapper local_f8;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *local_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  QModelIndexWrapper local_c8;
  Mapping *local_b0;
  undefined8 local_a8;
  quintptr local_a0;
  QAbstractItemModel *local_98;
  undefined8 local_90;
  quintptr local_88;
  QAbstractItemModel *local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QAbstractItemModel *local_68;
  QModelIndex *local_60;
  const_iterator local_58;
  QModelIndex *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  iterator local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::QList
            ((QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *)0x870d79);
  local_30.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QModelIndex>::begin((QList<QModelIndex> *)in_stack_fffffffffffffde0);
  while( true ) {
    o = QList<QModelIndex>::end((QList<QModelIndex> *)in_stack_fffffffffffffde0);
    bVar5 = QList<QModelIndex>::iterator::operator!=(&local_30,o);
    if (!bVar5) break;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = QList<QModelIndex>::iterator::operator*(&local_30);
    local_48._0_4_ = pQVar7->r;
    local_48._4_4_ = pQVar7->c;
    puStack_40 = (undefined1 *)pQVar7->i;
    local_38.ptr = (pQVar7->m).ptr;
    if (in_ECX == 1) {
      local_194 = QModelIndex::row((QModelIndex *)&local_48);
    }
    else {
      local_194 = QModelIndex::column((QModelIndex *)&local_48);
    }
    if (local_194 < in_R8D) {
      QList<QModelIndex>::iterator::operator++(&local_30);
    }
    else if (((in_stack_00000010 & 1) == 0) || (in_R9D < local_194)) {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::QModelIndex((QModelIndex *)0x870ff2);
      if ((in_stack_00000010 & 1) == 0) {
        local_1ac = local_194 + in_stack_00000008;
      }
      else {
        local_1ac = local_194 - in_stack_00000008;
      }
      if (in_ECX == 1) {
        ppQVar8 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                *)in_stack_fffffffffffffde0);
        pQVar1 = *ppQVar8;
        uVar6 = QModelIndex::column((QModelIndex *)&local_48);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (&local_90,pQVar1,(ulong)local_1ac,(ulong)uVar6,in_RSI);
        local_78 = (undefined1 *)local_90;
        puStack_70 = (undefined1 *)local_88;
        local_68 = local_80;
      }
      else {
        ppQVar8 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                *)in_stack_fffffffffffffde0);
        pQVar1 = *ppQVar8;
        uVar6 = QModelIndex::row((QModelIndex *)&local_48);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (&local_a8,pQVar1,(ulong)uVar6,(ulong)local_1ac,in_RSI);
        local_78 = (undefined1 *)local_a8;
        puStack_70 = (undefined1 *)local_a0;
        local_68 = local_98;
      }
      pQVar7 = QList<QModelIndex>::iterator::operator*(&local_30);
      (pQVar7->m).ptr = local_68;
      *(undefined1 **)pQVar7 = local_78;
      pQVar7->i = (quintptr)puStack_70;
      QList<QModelIndex>::iterator::operator++(&local_30);
      QtPrivate::QModelIndexWrapper::QModelIndexWrapper(&local_c8,(QModelIndex *)&local_48);
      local_b0 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::take
                           ((QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>
                             *)in_stack_fffffffffffffde0,
                            (QModelIndexWrapper *)in_stack_fffffffffffffdd8);
      QList<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>>::
      emplace_back<QModelIndex&,QSortFilterProxyModelPrivate::Mapping*&>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(Mapping **)0x871210);
    }
    else {
      local_60 = local_30.i;
      QList<QModelIndex>::const_iterator::const_iterator(&local_58,local_30);
      pos_00.i._7_1_ = in_stack_fffffffffffffe0f;
      pos_00.i._0_7_ = in_stack_fffffffffffffe08;
      local_50 = (QModelIndex *)QList<QModelIndex>::erase(in_stack_fffffffffffffdf0,pos_00);
      local_30 = (iterator)local_50;
      remove_from_mapping((QSortFilterProxyModelPrivate *)
                          CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                          in_stack_fffffffffffffe00);
    }
  }
  local_d0.i = (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)&DAT_aaaaaaaaaaaaaaaa;
  local_d0 = QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::begin
                       (in_stack_fffffffffffffde0);
  local_d8.i = (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::end
                       (in_stack_fffffffffffffde0);
  while( true ) {
    local_e0 = local_d8.i;
    bVar5 = QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::const_iterator
            ::operator!=(&local_d0,local_d8);
    if (!bVar5) break;
    i = QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::const_iterator::
        operator*(&local_d0);
    pMVar2 = i->second;
    (pMVar2->source_parent).m.ptr = (i->first).m.ptr;
    iVar4 = (i->first).c;
    qVar3 = (i->first).i;
    (pMVar2->source_parent).r = (i->first).r;
    (pMVar2->source_parent).c = iVar4;
    (pMVar2->source_parent).i = qVar3;
    QtPrivate::QModelIndexWrapper::QModelIndexWrapper(&local_f8,&i->first);
    QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::insert
              ((QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> *)
               in_stack_fffffffffffffde0,(QModelIndexWrapper *)in_stack_fffffffffffffdd8,
               (Mapping **)0x871356);
    QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::const_iterator::
    operator++(&local_d0);
  }
  QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::~QList
            ((QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *)0x87139d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::updateChildrenMapping(const QModelIndex &source_parent, Mapping *parent_mapping,
                                                         Direction direction, int start, int end, int delta_item_count, bool remove)
{
    // see if any mapped children should be (re)moved
    QList<std::pair<QModelIndex, Mapping *>> moved_source_index_mappings;
    auto it2 = parent_mapping->mapped_children.begin();
    for ( ; it2 != parent_mapping->mapped_children.end();) {
        const QModelIndex source_child_index = *it2;
        const int pos = (direction == Direction::Rows)
                        ? source_child_index.row()
                        : source_child_index.column();
        if (pos < start) {
            // not affected
            ++it2;
        } else if (remove && pos <= end) {
            // in the removed interval
            it2 = parent_mapping->mapped_children.erase(it2);
            remove_from_mapping(source_child_index);
        } else {
            // below the removed items -- recompute the index
            QModelIndex new_index;
            const int newpos = remove ? pos - delta_item_count : pos + delta_item_count;
            if (direction == Direction::Rows) {
                new_index = model->index(newpos,
                                         source_child_index.column(),
                                         source_parent);
            } else {
                new_index = model->index(source_child_index.row(),
                                         newpos,
                                         source_parent);
            }
            *it2 = new_index;
            ++it2;

            // update mapping
            Mapping *cm = source_index_mapping.take(source_child_index);
            Q_ASSERT(cm);
            // we do not reinsert right away, because the new index might be identical with another, old index
            moved_source_index_mappings.emplace_back(new_index, cm);
        }
    }

    // reinsert moved, mapped indexes
    for (auto &pair : std::as_const(moved_source_index_mappings)) {
        pair.second->source_parent = pair.first;
        source_index_mapping.insert(pair.first, pair.second);
    }
}